

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.h
# Opt level: O1

bool __thiscall
Clasp::Antecedent::minimize<Clasp::Solver>(Antecedent *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  long *plVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined4 in_register_00000014;
  
  plVar1 = (long *)this->data_;
  if (((ulong)plVar1 & 3) == 0) {
    uVar3 = (**(code **)(*plVar1 + 0x38))(plVar1,s,CONCAT44(in_register_00000014,p.rep_),rec);
    return (bool)uVar3;
  }
  bVar2 = Solver::ccMinimize(s,(Literal)((uint)((ulong)plVar1 >> 0x20) & 0xfffffffe),rec);
  if (bVar2) {
    bVar2 = true;
    if (((uint)plVar1 & 3) == 1) {
      bVar2 = Solver::ccMinimize(s,(Literal)((uint)(this->data_ >> 1) & 0xfffffffe),rec);
      return bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool minimize(S& s, Literal p, CCMinRecursive* rec) const {
		assert(!isNull());
		Type t = type();
		if (t == Generic) {
			return constraint()->minimize(s, p, rec);
		}
		return s.ccMinimize(firstLiteral(), rec) && (t != Ternary || s.ccMinimize(secondLiteral(), rec));
	}